

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::ZNames::ZNamesLoader::loadMetaZone
          (ZNamesLoader *this,UResourceBundle *zoneStrings,UnicodeString *mzID,UErrorCode *errorCode
          )

{
  UErrorCode localStatus;
  char key [129];
  UErrorCode local_bc;
  char local_b8 [144];
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  mergeTimeZoneKey(mzID,local_b8);
  local_bc = U_ZERO_ERROR;
  this->names[4] = (UChar *)0x0;
  this->names[5] = (UChar *)0x0;
  this->names[2] = (UChar *)0x0;
  this->names[3] = (UChar *)0x0;
  this->names[0] = (UChar *)0x0;
  this->names[1] = (UChar *)0x0;
  this->names[6] = (UChar *)0x0;
  ures_getAllItemsWithFallback_63(zoneStrings,local_b8,&this->super_ResourceSink,&local_bc);
  if (local_bc < U_ILLEGAL_ARGUMENT_ERROR) {
    *errorCode = local_bc;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }